

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void Expect(istream *input,char c)

{
  ReadException *this;
  undefined1 local_c8 [48];
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [38];
  char local_12;
  char local_11;
  char read;
  istream *piStack_10;
  char c_local;
  istream *input_local;
  
  local_11 = c;
  piStack_10 = input;
  local_12 = std::istream::get();
  if (local_12 != local_11) {
    this = (ReadException *)__cxa_allocate_exception(0x28);
    s_abi_cxx11_(local_98,"unexpected char: expected ",0x1a);
    std::operator+(local_78,(char)local_98);
    s_abi_cxx11_(local_c8,", got ",6);
    std::operator+(local_58,local_78);
    std::operator+(local_38,(char)local_58);
    ReadException::ReadException(this,local_38);
    __cxa_throw(this,&ReadException::typeinfo,ReadException::~ReadException);
  }
  return;
}

Assistant:

static void Expect(std::istream &input, char c) {
  char read = (char)input.get();
  if (read != c) {
    throw ReadException("unexpected char: expected "s + c + ", got "s + read);
  }
}